

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::RenderTarget(RenderTarget *this)

{
  this->_vptr_RenderTarget = (_func_int **)&PTR__RenderTarget_001dd2d0;
  View::View(&this->m_defaultView);
  View::View(&this->m_view);
  *(undefined8 *)&(this->m_cache).field_0x70 = 0;
  *(undefined8 *)&(this->m_cache).field_0x78 = 0;
  *(undefined8 *)&(this->m_cache).field_0x60 = 0;
  *(undefined8 *)&(this->m_cache).field_0x68 = 0;
  *(undefined8 *)&(this->m_cache).field_0x50 = 0;
  *(undefined8 *)&(this->m_cache).field_0x58 = 0;
  *(undefined8 *)&(this->m_cache).field_0x40 = 0;
  *(undefined8 *)&(this->m_cache).field_0x48 = 0;
  *(undefined8 *)&(this->m_cache).field_0x30 = 0;
  *(undefined8 *)&(this->m_cache).field_0x38 = 0;
  (this->m_cache).lastTextureId = 0;
  (this->m_cache).texCoordsArrayEnabled = false;
  (this->m_cache).useVertexCache = false;
  *(undefined6 *)&(this->m_cache).field_0x2a = 0;
  (this->m_cache).lastBlendMode.alphaSrcFactor = Zero;
  (this->m_cache).lastBlendMode.alphaDstFactor = Zero;
  *(undefined8 *)&(this->m_cache).lastBlendMode.alphaEquation = 0;
  (this->m_cache).enable = false;
  (this->m_cache).glStatesSet = false;
  (this->m_cache).viewChanged = false;
  (this->m_cache).field_0x3 = 0;
  (this->m_cache).lastBlendMode.colorSrcFactor = Zero;
  (this->m_cache).lastBlendMode.colorDstFactor = Zero;
  (this->m_cache).lastBlendMode.colorEquation = Add;
  StatesCache::StatesCache(&this->m_cache);
  this->m_id = 0;
  (this->m_cache).glStatesSet = false;
  return;
}

Assistant:

RenderTarget::RenderTarget() :
m_defaultView(),
m_view       (),
m_cache      (),
m_id         (0)
{
    m_cache.glStatesSet = false;
}